

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

DdNode * Llb_ManConstructGroupBdd(Llb_Man_t *p,Llb_Grp_t *pGroup)

{
  void *pvVar1;
  DdManager *pDVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  DdNode *pDVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  DdNode *n;
  void *pvVar9;
  int local_58;
  int local_54;
  int k;
  int i;
  DdNode *bTemp;
  DdNode *bXor;
  DdNode *bRes;
  DdNode *bBdd1;
  DdNode *bBdd0;
  Aig_Obj_t *pObj;
  Llb_Grp_t *pGroup_local;
  Llb_Man_t *p_local;
  
  pDVar6 = Cudd_ReadOne(p->dd);
  pAVar7 = Aig_ManConst1(p->pAig);
  (pAVar7->field_5).pData = pDVar6;
  for (local_54 = 0; iVar4 = Vec_PtrSize(pGroup->vIns), local_54 < iVar4; local_54 = local_54 + 1) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vIns,local_54);
    pDVar2 = p->dd;
    pVVar3 = p->vObj2Var;
    iVar4 = Aig_ObjId(pAVar7);
    iVar4 = Vec_IntEntry(pVVar3,iVar4);
    pDVar6 = Cudd_bddIthVar(pDVar2,iVar4);
    (pAVar7->field_5).pData = pDVar6;
  }
  for (local_54 = 0; iVar4 = Vec_PtrSize(pGroup->vNodes), local_54 < iVar4; local_54 = local_54 + 1)
  {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vNodes,local_54);
    pAVar8 = Aig_ObjFanin0(pAVar7);
    pvVar9 = (pAVar8->field_5).pData;
    iVar4 = Aig_ObjFaninC0(pAVar7);
    pAVar8 = Aig_ObjFanin1(pAVar7);
    pvVar1 = (pAVar8->field_5).pData;
    iVar5 = Aig_ObjFaninC1(pAVar7);
    pDVar6 = Cudd_bddAnd(p->dd,(DdNode *)((ulong)pvVar9 ^ (long)iVar4),
                         (DdNode *)((ulong)pvVar1 ^ (long)iVar5));
    (pAVar7->field_5).pData = pDVar6;
    if ((pAVar7->field_5).pData == (void *)0x0) {
      for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
        pvVar9 = Vec_PtrEntry(pGroup->vNodes,local_58);
        if (*(long *)((long)pvVar9 + 0x28) != 0) {
          Cudd_RecursiveDeref(p->dd,*(DdNode **)((long)pvVar9 + 0x28));
        }
      }
      return (DdNode *)0x0;
    }
    Cudd_Ref((DdNode *)(pAVar7->field_5).pData);
  }
  bXor = Cudd_ReadOne(p->dd);
  Cudd_Ref(bXor);
  local_54 = 0;
  while( true ) {
    iVar4 = Vec_PtrSize(pGroup->vOuts);
    if (iVar4 <= local_54) {
      for (local_54 = 0; iVar4 = Vec_PtrSize(pGroup->vNodes), local_54 < iVar4;
          local_54 = local_54 + 1) {
        pvVar9 = Vec_PtrEntry(pGroup->vNodes,local_54);
        Cudd_RecursiveDeref(p->dd,*(DdNode **)((long)pvVar9 + 0x28));
      }
      Cudd_Deref(bXor);
      return bXor;
    }
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vOuts,local_54);
    iVar4 = Aig_ObjIsCo(pAVar7);
    if (iVar4 == 0) {
      bBdd1 = (DdNode *)(pAVar7->field_5).pData;
    }
    else {
      pAVar8 = Aig_ObjFanin0(pAVar7);
      pvVar9 = (pAVar8->field_5).pData;
      iVar4 = Aig_ObjFaninC0(pAVar7);
      bBdd1 = (DdNode *)((ulong)pvVar9 ^ (long)iVar4);
    }
    pDVar2 = p->dd;
    pVVar3 = p->vObj2Var;
    iVar4 = Aig_ObjId(pAVar7);
    iVar4 = Vec_IntEntry(pVVar3,iVar4);
    pDVar6 = Cudd_bddIthVar(pDVar2,iVar4);
    pDVar6 = Cudd_bddXor(p->dd,bBdd1,pDVar6);
    Cudd_Ref(pDVar6);
    n = Cudd_bddAnd(p->dd,bXor,(DdNode *)((ulong)pDVar6 ^ 1));
    if (n == (DdNode *)0x0) break;
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,bXor);
    Cudd_RecursiveDeref(p->dd,pDVar6);
    local_54 = local_54 + 1;
    bXor = n;
  }
  Cudd_RecursiveDeref(p->dd,bXor);
  Cudd_RecursiveDeref(p->dd,pDVar6);
  for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
    pvVar9 = Vec_PtrEntry(pGroup->vNodes,local_58);
    if (*(long *)((long)pvVar9 + 0x28) != 0) {
      Cudd_RecursiveDeref(p->dd,*(DdNode **)((long)pvVar9 + 0x28));
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_ManConstructGroupBdd( Llb_Man_t * p, Llb_Grp_t * pGroup )
{
    Aig_Obj_t * pObj;
    DdNode * bBdd0, * bBdd1, * bRes, * bXor, * bTemp;
    int i, k;
    Aig_ManConst1(p->pAig)->pData = Cudd_ReadOne( p->dd );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        pObj->pData = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( p->dd, bBdd0, bBdd1, p->pPars->TimeTarget );  
        pObj->pData = Cudd_bddAnd( p->dd, bBdd0, bBdd1 );  
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, pGroup->vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( Aig_ObjIsCo(pObj) )
            bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        else
            bBdd0 = (DdNode *)pObj->pData;
        bBdd1 = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bXor  = Cudd_bddXor( p->dd, bBdd0, bBdd1 );                  Cudd_Ref( bXor );
//        bRes  = Extra_bddAndTime( p->dd, bTemp = bRes, Cudd_Not(bXor), p->pPars->TimeTarget );  
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, Cudd_Not(bXor) );  
        if ( bRes == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bXor );
            Vec_PtrForEachEntryStop( Aig_Obj_t *, pGroup->vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bXor );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vNodes, pObj, i )
        Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
    Cudd_Deref( bRes );
    return bRes;
}